

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_recursive_cte.hpp
# Opt level: O0

void __thiscall duckdb::LogicalRecursiveCTE::~LogicalRecursiveCTE(LogicalRecursiveCTE *this)

{
  LogicalRecursiveCTE *in_RDI;
  
  ~LogicalRecursiveCTE(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

LogicalRecursiveCTE() : LogicalCTE(LogicalOperatorType::LOGICAL_RECURSIVE_CTE) {
	}